

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlitePagerAcquire(Pager *pPager,pgno pgno,unqlite_page **ppPage,int fetchOnly,int noContent)

{
  ulong uVar1;
  int iVar2;
  Page *pPage;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  
  iVar2 = pager_shared_lock(pPager);
  if (iVar2 == 0) {
    if (pPager->nPage != 0) {
      for (pPage = pPager->apHash[(uint)pgno & pPager->nSize - 1]; pPage != (Page *)0x0;
          pPage = pPage->pNextCollide) {
        if (pPage->pgno == pgno) goto LAB_001164cf;
      }
    }
    pPage = (Page *)0x0;
LAB_001164cf:
    if (fetchOnly == 0) {
      if (pPage == (Page *)0x0) {
        pPage = pager_alloc_page(pPager,pgno);
        if (pPage == (Page *)0x0) {
          unqliteGenError(pPager->pDb,"unQLite is running out of memory");
          return -1;
        }
        if ((pPager->is_mem == 0) && (uVar1 = pPage->pgno, uVar1 < pPager->dbSize)) {
          if (((pPager->iOpenFlags & 0x100) == 0) || (pPager->pMmap == (void *)0x0)) {
            iVar2 = (*pPager->pfd->pMethods->xRead)
                              (pPager->pfd,pPage->zData,(long)pPager->iPageSize,
                               uVar1 * (long)pPager->iPageSize);
          }
          else {
            pPage->zData = (uchar *)((long)pPager->pMmap + uVar1 * (long)pPager->iPageSize);
            iVar2 = 0;
          }
        }
        else {
          iVar5 = 0;
          iVar2 = 0;
          if ((ulong)(uint)pPager->iPageSize != 0) {
            puVar4 = pPage->zData;
            puVar3 = puVar4 + (uint)pPager->iPageSize;
            do {
              *puVar4 = '\0';
              iVar2 = iVar5;
              if (puVar3 <= puVar4 + 1) break;
              puVar4[1] = '\0';
              if (puVar3 <= puVar4 + 2) break;
              puVar4[2] = '\0';
              if (puVar3 <= puVar4 + 3) break;
              puVar4[3] = '\0';
              puVar4 = puVar4 + 4;
            } while (puVar4 < puVar3);
          }
        }
        if (iVar2 != 0) {
          SyMemBackendPoolFree(pPager->pAllocator,pPage);
          return iVar2;
        }
        pager_link_page(pPager,pPage);
      }
      else if (ppPage != (unqlite_page **)0x0) {
        page_ref(pPage);
      }
      iVar2 = 0;
      if (ppPage != (unqlite_page **)0x0) {
        *ppPage = (unqlite_page *)pPage;
        iVar2 = 0;
      }
    }
    else {
      if (ppPage != (unqlite_page **)0x0) {
        *ppPage = (unqlite_page *)pPage;
      }
      iVar2 = -6;
      if (pPage != (Page *)0x0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int unqlitePagerAcquire(
  Pager *pPager,      /* The pager open on the database file */
  pgno pgno,          /* Page number to fetch */
  unqlite_page **ppPage,    /* OUT: Acquired page */
  int fetchOnly,      /* Cache lookup only */
  int noContent       /* Do not bother reading content from disk if true */
)
{
	Page *pPage;
	int rc;
	/* Acquire a shared lock (if not yet done) on the database and rollback any hot-journal if present */
	rc = pager_shared_lock(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Fetch the page from the cache */
	pPage = pager_fetch_page(pPager,pgno);
	if( fetchOnly ){
		if( ppPage ){
			*ppPage = (unqlite_page *)pPage;
		}
		return pPage ? UNQLITE_OK : UNQLITE_NOTFOUND;
	}
	if( pPage == 0 ){
		/* Allocate a new page */
		pPage = pager_alloc_page(pPager,pgno);
		if( pPage == 0 ){
			unqliteGenOutofMem(pPager->pDb);
			return UNQLITE_NOMEM;
		}
		/* Read page contents */
		rc = pager_get_page_contents(pPager,pPage,noContent);
		if( rc != UNQLITE_OK ){
			SyMemBackendPoolFree(pPager->pAllocator,pPage);
			return rc;
		}
		/* Link the page */
		pager_link_page(pPager,pPage);
	}else{
		if( ppPage ){
			page_ref(pPage);
		}
	}
	/* All done, page is loaded in memeory */
	if( ppPage ){
		*ppPage = (unqlite_page *)pPage;
	}
	return UNQLITE_OK;
}